

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O3

uint dumpParentChain(DWARFDie Die,raw_ostream *OS,uint Indent,DIDumpOptions DumpOpts,uint Depth)

{
  uint Indent_00;
  DWARFDie Die_00;
  undefined1 local_38 [8];
  DWARFDie Die_local;
  
  Die_local.U = (DWARFUnit *)Die.Die;
  local_38 = (undefined1  [8])Die.U;
  if ((Die_local.U != (DWARFUnit *)0x0 && local_38 != (undefined1  [8])0x0) &&
     (Depth <= DumpOpts.ParentRecurseDepth - 1)) {
    Die_00 = llvm::DWARFUnit::getParent((DWARFUnit *)local_38,(DWARFDebugInfoEntry *)Die_local.U);
    Indent_00 = dumpParentChain(Die_00,OS,Indent,DumpOpts,Depth + 1);
    llvm::DWARFDie::dump((DWARFDie *)local_38,OS,Indent_00,DumpOpts);
    Indent = Indent_00 + 2;
  }
  return Indent;
}

Assistant:

static unsigned dumpParentChain(DWARFDie Die, raw_ostream &OS, unsigned Indent,
                                DIDumpOptions DumpOpts, unsigned Depth = 0) {
  if (!Die)
    return Indent;
  if (DumpOpts.ParentRecurseDepth > 0 && Depth >= DumpOpts.ParentRecurseDepth)
    return Indent;
  Indent = dumpParentChain(Die.getParent(), OS, Indent, DumpOpts, Depth + 1);
  Die.dump(OS, Indent, DumpOpts);
  return Indent + 2;
}